

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<short>(Object_Data *this,short t,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  undefined1 local_5d [13];
  Any local_50;
  Any local_48 [3];
  element_type *local_30;
  element_type *ptr;
  shared_ptr<short> p;
  bool t_return_value_local;
  short t_local;
  
  p.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = t_return_value;
  p.super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_2_ = t;
  std::make_shared<short,short>((short *)&ptr);
  local_30 = std::__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2> *)&ptr);
  detail::Get_Type_Info<short>::get();
  detail::Any::Any<std::shared_ptr<short>,void>(&local_50,(shared_ptr<short> *)&ptr);
  local_5d[0] = 0;
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,short*&,bool&>
            ((Type_Info *)this,local_48,(bool *)&local_50,(short **)local_5d,(bool *)&local_30);
  detail::Any::~Any(&local_50);
  std::shared_ptr<short>::~shared_ptr((shared_ptr<short> *)&ptr);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }